

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

void replay_all_hashes(ResourceTag tag,DatabaseInterface *db_iface,StateReplayer *replayer,
                      StateCreatorInterface *iface,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *filter)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  reference puVar5;
  unsigned_long hash_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  undefined1 local_78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t size;
  value_type hash;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *filter_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json_local;
  StateCreatorInterface *iface_local;
  StateReplayer *replayer_local;
  DatabaseInterface *db_iface_local;
  ResourceTag tag_local;
  
  if (filter == (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)0x0) {
    uVar2 = (*db_iface->_vptr_DatabaseInterface[6])
                      (db_iface,(ulong)tag,
                       &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    if ((uVar2 & 1) == 0) {
      exit(1);
    }
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range2_1 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
               (size_type)
               hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(allocator_type *)((long)&__range2_1 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range2_1 + 7));
    puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    uVar2 = (*db_iface->_vptr_DatabaseInterface[6])
                      (db_iface,(ulong)tag,
                       &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,puVar4);
    if ((uVar2 & 1) == 0) {
      exit(1);
    }
    __end2_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    hash_1 = (unsigned_long)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&hash_1), bVar1) {
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2_1);
      replay_hash(tag,*puVar5,db_iface,replayer,iface,state_json);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  }
  else {
    __end2 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(filter);
    hash = (value_type)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(filter);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<unsigned_long,_false>,
                              (_Node_iterator_base<unsigned_long,_false> *)&hash), bVar1) {
      pvVar3 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end2);
      replay_hash(tag,*pvVar3,db_iface,replayer,iface,state_json);
      std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void replay_all_hashes(ResourceTag tag, DatabaseInterface &db_iface,
                              StateReplayer &replayer, StateCreatorInterface &iface,
                              vector<uint8_t> &state_json,
                              const unordered_set<Hash> *filter)
{
	if (filter)
	{
		for (auto hash : *filter)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
	else
	{
		size_t size;
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, nullptr))
			exit(EXIT_FAILURE);

		vector<Hash> hashes(size);
		if (!db_iface.get_hash_list_for_resource_tag(tag, &size, hashes.data()))
			exit(EXIT_FAILURE);

		for (auto hash : hashes)
			replay_hash(tag, hash, db_iface, replayer, iface, state_json);
	}
}